

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_canvas.c
# Opt level: O3

_glist * canvas_new(void *dummy,t_symbol *sel,int argc,t_atom *argv)

{
  ushort uVar1;
  ushort uVar2;
  undefined8 uVar3;
  int iVar4;
  _glist *x;
  _glist *p_Var5;
  int *piVar6;
  _canvasenvironment *p_Var7;
  t_atom *ptVar8;
  _class *p_Var9;
  _instancecanvas *p_Var10;
  _canvasenvironment **pp_Var11;
  uint uVar12;
  t_symbol *ptVar13;
  t_float tVar14;
  t_float tVar15;
  t_float tVar16;
  t_float tVar17;
  int local_78;
  int iStack_74;
  int iStack_70;
  int iStack_6c;
  int local_68;
  
  x = (_glist *)pd_new(canvas_class);
  p_Var5 = (_glist *)pd_findbyclass(&s__X,canvas_class);
  if (p_Var5 == (_glist *)0x0) {
    piVar6 = &sys_defaultfont;
  }
  else {
    piVar6 = &p_Var5->gl_font;
  }
  local_68 = *piVar6;
  glist_init(x);
  (x->gl_obj).field_0x2e = ((x->gl_obj).field_0x2e & 0xfc) + 1;
  if (p_Var5 == (_glist *)0x0) {
    x->gl_next = pd_maininstance.pd_canvaslist;
    pd_maininstance.pd_canvaslist = x;
  }
  if (argc == 6) {
    tVar14 = atom_getfloatarg(0,6,argv);
    tVar15 = atom_getfloatarg(1,6,argv);
    tVar16 = atom_getfloatarg(2,6,argv);
    tVar17 = atom_getfloatarg(3,6,argv);
    local_78 = (int)tVar16;
    iStack_74 = (int)tVar17;
    iStack_70 = (int)tVar14;
    iStack_6c = (int)tVar15;
    ptVar13 = atom_getsymbolarg(4,6,argv);
    tVar14 = atom_getfloatarg(5,6,argv);
    uVar12 = (uint)tVar14;
  }
  else {
    ptVar13 = &s_;
    if (argc == 5) {
      uVar12 = 0;
      tVar14 = atom_getfloatarg(0,5,argv);
      tVar15 = atom_getfloatarg(1,5,argv);
      tVar16 = atom_getfloatarg(2,5,argv);
      tVar17 = atom_getfloatarg(3,5,argv);
      local_78 = (int)tVar16;
      iStack_74 = (int)tVar17;
      iStack_70 = (int)tVar14;
      iStack_6c = (int)tVar15;
      tVar14 = atom_getfloatarg(4,5,argv);
      local_68 = (int)tVar14;
    }
    else {
      local_78 = 0x1c2;
      iStack_74 = 300;
      iStack_70 = 0;
      iStack_6c = 0x32;
      uVar12 = 0;
    }
  }
  if (((pd_maininstance.pd_gui)->i_newdirectory == (t_symbol *)0x0) ||
     (*(pd_maininstance.pd_gui)->i_newdirectory->s_name == '\0')) {
    pp_Var11 = &x->gl_env;
  }
  else {
    p_Var7 = (_canvasenvironment *)getbytes(0x28);
    x->gl_env = p_Var7;
    ptVar8 = (pd_maininstance.pd_gui)->i_newargv;
    p_Var10 = pd_maininstance.pd_gui;
    if (ptVar8 == (t_atom *)0x0) {
      ptVar8 = (t_atom *)getbytes(0);
      p_Var10 = pd_maininstance.pd_gui;
      (pd_maininstance.pd_gui)->i_newargv = ptVar8;
    }
    p_Var7->ce_dir = p_Var10->i_newdirectory;
    p_Var7->ce_argc = p_Var10->i_newargc;
    pp_Var11 = (_canvasenvironment **)&p_Var10->i_newargv;
    p_Var7->ce_argv = ptVar8;
    iVar4 = p_Var10->i_dollarzero;
    p_Var10->i_dollarzero = iVar4 + 1;
    p_Var7->ce_dollarzero = iVar4;
    p_Var7->ce_path = (t_namelist *)0x0;
    p_Var10->i_newdirectory = &s_;
    p_Var10->i_newargc = 0;
  }
  *pp_Var11 = (_canvasenvironment *)0x0;
  canvas_undo_init(x);
  x->gl_x1 = 0.0;
  x->gl_y1 = 0.0;
  x->gl_x2 = 1.0;
  x->gl_y2 = 1.0;
  canvas_dosetbounds(x,iStack_70,iStack_6c,local_78 + iStack_70,iStack_74 + iStack_6c);
  x->gl_owner = p_Var5;
  x->field_0xe9 = x->field_0xe9 & 0xf7;
  if ((*ptVar13->s_name == '\0') &&
     (ptVar13 = (pd_maininstance.pd_gui)->i_newfilename, ptVar13 == (t_symbol *)0x0)) {
    ptVar13 = gensym("Pd");
  }
  x->gl_name = ptVar13;
  canvas_bind(x);
  *(ushort *)&x->field_0xe8 = (ushort)*(undefined4 *)&x->field_0xe8 & 0xff77 | 8;
  if (uVar12 == 0) {
    uVar12 = 0;
  }
  else {
    ptVar13 = gensym("#X");
    if ((ptVar13->s_thing != (_class **)0x0) &&
       (ptVar13 = gensym("#X"), *ptVar13->s_thing == canvas_class)) {
      ptVar13 = gensym("#X");
      p_Var9 = (_class *)ptVar13->s_thing;
      do {
        if (p_Var9 == (_class *)0x0) goto LAB_00136a6f;
        uVar3 = p_Var9 + 1;
        p_Var9 = (_class *)p_Var9->c_floatmethod;
      } while (*(_class **)(uVar3 + 0x40) == (_class *)0x0);
      if (p_Var9 != (_class *)0x0) {
        uVar12 = 0;
      }
    }
  }
LAB_00136a6f:
  uVar2 = (ushort)*(undefined4 *)&x->field_0xe8;
  uVar1 = (ushort)((uVar12 & 1) << 4);
  *(ushort *)&x->field_0xe8 = uVar2 & 0xffef | uVar1;
  iVar4 = strncmp(x->gl_name->s_name,"PDUNTITLED",10);
  *(ushort *)&x->field_0xe8 = uVar2 & 0xffcf | uVar1 | (ushort)(iVar4 == 0) << 5;
  iVar4 = sys_nearestfontsize(local_68);
  x->gl_font = iVar4;
  if (p_Var5 == (_glist *)0x0) {
    iVar4 = 1;
  }
  else {
    iVar4 = p_Var5->gl_zoom;
  }
  x->gl_zoom = iVar4;
  pd_pushsym((t_pd *)x);
  return x;
}

Assistant:

t_canvas *canvas_new(void *dummy, t_symbol *sel, int argc, t_atom *argv)
{
    t_canvas *x = (t_canvas *)pd_new(canvas_class);
    t_canvas *owner = canvas_getcurrent();
    t_symbol *s = &s_;
    int vis = 0, width = GLIST_DEFCANVASWIDTH, height = GLIST_DEFCANVASHEIGHT;
    int xloc = GLIST_DEFCANVASXLOC, yloc = GLIST_DEFCANVASYLOC;
    int font = (owner ? owner->gl_font : sys_defaultfont);
    glist_init(x);
    x->gl_obj.te_type = T_OBJECT;
    if (!owner)
        canvas_addtolist(x);
    /* post("canvas %lx, owner %lx", x, owner); */

    if (argc == 5)  /* toplevel: x, y, w, h, font */
    {
        xloc = atom_getfloatarg(0, argc, argv);
        yloc = atom_getfloatarg(1, argc, argv);
        width = atom_getfloatarg(2, argc, argv);
        height = atom_getfloatarg(3, argc, argv);
        font = atom_getfloatarg(4, argc, argv);
    }
    else if (argc == 6)  /* subwindow: x, y, w, h, name, vis */
    {
        xloc = atom_getfloatarg(0, argc, argv);
        yloc = atom_getfloatarg(1, argc, argv);
        width = atom_getfloatarg(2, argc, argv);
        height = atom_getfloatarg(3, argc, argv);
        s = atom_getsymbolarg(4, argc, argv);
        vis = atom_getfloatarg(5, argc, argv);
    }

        /* (otherwise assume we're being created from the menu.) */
    if (THISGUI->i_newdirectory &&
        THISGUI->i_newdirectory->s_name[0])
    {
        t_canvasenvironment *env = x->gl_env =
            (t_canvasenvironment *)getbytes(sizeof(*x->gl_env));
        if (!THISGUI->i_newargv)
            THISGUI->i_newargv = getbytes(0);
        env->ce_dir = THISGUI->i_newdirectory;
        env->ce_argc = THISGUI->i_newargc;
        env->ce_argv = THISGUI->i_newargv;
        env->ce_dollarzero = THISGUI->i_dollarzero++;
        env->ce_path = 0;
        THISGUI->i_newdirectory = &s_;
        THISGUI->i_newargc = 0;
        THISGUI->i_newargv = 0;
    }
    else x->gl_env = 0;

        /* initialize private data, like the undo-queue */
    canvas_undo_init(x);

    x->gl_x1 = 0;
    x->gl_y1 = 0;
    x->gl_x2 = 1;
    x->gl_y2 = 1;
    canvas_dosetbounds(x, xloc, yloc, xloc + width, yloc + height);
    x->gl_owner = owner;
    x->gl_isclone = 0;
    x->gl_name = (*s->s_name ? s :
        (THISGUI->i_newfilename ? THISGUI->i_newfilename : gensym("Pd")));
    canvas_bind(x);
    x->gl_loading = 1;
    x->gl_goprect = 0;      /* no GOP rectangle unless it's turned on later */
        /* cancel "vis" flag if we're a subpatch of an
         abstraction inside another patch.  A separate mechanism prevents
         the toplevel abstraction from showing up. */
    if (vis && gensym("#X")->s_thing &&
        ((*gensym("#X")->s_thing) == canvas_class))
    {
        t_canvas *zzz = (t_canvas *)(gensym("#X")->s_thing);
        while (zzz && !zzz->gl_env)
            zzz = zzz->gl_owner;
        if (zzz && canvas_isabstraction(zzz) && zzz->gl_owner)
            vis = 0;
    }
    x->gl_willvis = vis;
    x->gl_edit = !UNTITLED_STRNCMP(x->gl_name->s_name);
    x->gl_font = sys_nearestfontsize(font);
    x->gl_zoom = (owner ? owner->gl_zoom : 1);
    pd_pushsym(&x->gl_pd);
    return(x);
}